

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::~cmCursesMainForm(cmCursesMainForm *this)

{
  FORM *form;
  
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_00778bc0;
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->OldSearchString);
  std::__cxx11::string::~string((string *)&this->SearchString);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr(&this->CMakeInstance);
  std::unique_ptr<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>::
  ~unique_ptr(&this->EmptyCacheEntry);
  std::_Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>::~_Vector_base
            (&(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HelpMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Args);
  std::__cxx11::string::~string((string *)&this->LastProgress);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Outputs);
  std::unique_ptr<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>::
  ~unique_ptr(&this->LogForm);
  std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::~vector
            (&this->Entries);
  cmCursesForm::~cmCursesForm(&this->super_cmCursesForm);
  return;
}

Assistant:

cmCursesMainForm::~cmCursesMainForm()
{
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
}